

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::
write_decimal<unsigned__int128>
          (arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler> *this,
          unsigned___int128 value)

{
  undefined1 auVar1 [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  detail *pdVar2;
  long in_RDX;
  detail *in_RSI;
  bool bVar3;
  undefined8 in_stack_ffffffffffffff48;
  detail *local_98;
  detail **local_90;
  checked_ptr<typename_buffer<char>::value_type> *it;
  long local_80;
  int local_6c;
  int num_digits;
  byte local_49;
  detail *pdStack_48;
  bool negative;
  uint32_or_64_or_128_t<unsigned___int128> abs_value;
  unsigned___int128 value_local;
  arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler> *local_20;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_local;
  
  auVar1._8_8_ = this;
  auVar1._0_8_ = in_stack_ffffffffffffff48;
  pdStack_48 = in_RSI;
  abs_value._0_8_ = in_RDX;
  local_20 = this;
  local_49 = is_negative<unsigned___int128,_0>((unsigned___int128)auVar1);
  if ((bool)local_49) {
    bVar3 = pdStack_48 != (detail *)0x0;
    pdStack_48 = (detail *)-(long)pdStack_48;
    abs_value._0_8_ = -(ulong)bVar3 - (long)abs_value;
  }
  local_80 = (long)abs_value;
  it = (checked_ptr<typename_buffer<char>::value_type> *)pdStack_48;
  n._8_8_ = this;
  n._0_8_ = in_stack_ffffffffffffff48;
  local_6c = count_digits(pdStack_48,(uint128_t)n);
  pdVar2 = (detail *)
           arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::reserve
                     ((arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>
                       *)this,(long)(int)(uint)((local_49 & 1) != 0) + (long)local_6c);
  local_90 = &local_98;
  local_98 = pdVar2;
  if ((local_49 & 1) != 0) {
    local_98 = pdVar2 + 1;
    *pdVar2 = (detail)0x2d;
  }
  value_00._8_8_ = this;
  value_00._0_8_ = in_stack_ffffffffffffff48;
  pdVar2 = (detail *)
           format_decimal<char,char*,unsigned__int128>
                     (local_98,(char *)pdStack_48,(unsigned___int128)value_00,(int)(long)abs_value);
  *local_90 = pdVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }